

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  undefined8 *in_RSI;
  int in_EDI;
  int64_t t_main_end_us;
  int64_t t_start_us;
  int64_t t_quantize_us;
  int64_t t_main_start_us;
  ggml_ftype ftype;
  string fname_out;
  string fname_inp;
  ggml_context *ctx;
  ggml_init_params params;
  ggml_ftype in_stack_000004ec;
  string *in_stack_000004f0;
  string *in_stack_000004f8;
  FILE *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  allocator<char> *str;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  uint local_4;
  
  local_4 = 0;
  if (in_EDI == 4) {
    local_28 = 0;
    uStack_20 = 0;
    local_18 = 0;
    local_38 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_30 = ggml_init();
    ggml_free(local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    std::allocator<char>::~allocator(&local_69);
    str = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    std::allocator<char>::~allocator(&local_a1);
    ggml_parse_ftype((char *)str);
    lVar2 = ggml_time_us();
    lVar3 = ggml_time_us();
    bVar1 = gptj_model_quantize(in_stack_000004f8,in_stack_000004f0,in_stack_000004ec);
    __stream = _stderr;
    if (bVar1) {
      lVar5 = ggml_time_us();
      lVar6 = ggml_time_us();
      printf("\n");
      printf("%s: quantize time = %8.2f ms\n",SUB84((double)((float)(lVar5 - lVar3) / 1000.0),0),
             "main");
      printf("%s:    total time = %8.2f ms\n",SUB84((double)((float)(lVar6 - lVar2) / 1000.0),0),
             "main");
    }
    else {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s: failed to quantize model from \'%s\'\n","main",uVar4);
    }
    local_4 = (uint)!bVar1;
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_68);
  }
  else {
    fprintf(_stderr,"usage: %s model-f32.bin model-quant.bin type\n",*in_RSI);
    ggml_print_ftypes(in_stack_fffffffffffffee0);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    if (argc != 4) {
        fprintf(stderr, "usage: %s model-f32.bin model-quant.bin type\n", argv[0]);
        ggml_print_ftypes(stderr);
        return 1;
    }

    // needed to initialize f16 tables
    {
        struct ggml_init_params params = { 0, NULL, false };
        struct ggml_context * ctx = ggml_init(params);
        ggml_free(ctx);
    }

    const std::string fname_inp = argv[1];
    const std::string fname_out = argv[2];

    const ggml_ftype ftype = ggml_parse_ftype(argv[3]);

    const int64_t t_main_start_us = ggml_time_us();

    int64_t t_quantize_us = 0;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gptj_model_quantize(fname_inp, fname_out, ggml_ftype(ftype))) {
            fprintf(stderr, "%s: failed to quantize model from '%s'\n", __func__, fname_inp.c_str());
            return 1;
        }

        t_quantize_us = ggml_time_us() - t_start_us;
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n");
        printf("%s: quantize time = %8.2f ms\n", __func__, t_quantize_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    return 0;
}